

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::GetStringToken(Token *__return_storage_ptr__,WastLexer *this,WastParser *parser)

{
  char *pcVar1;
  byte *pbVar2;
  byte *pbVar3;
  Location loc;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  anon_class_8_1_8991fb9c column;
  undefined4 uStack_74;
  
  if (this->cursor_ < this->buffer_end_) {
    this->cursor_ = this->cursor_ + 1;
  }
  pcVar1 = this->token_start_;
  bVar4 = true;
  bVar5 = false;
  do {
    while( true ) {
      pbVar2 = (byte *)this->buffer_end_;
      pbVar3 = (byte *)this->cursor_;
      uVar6 = 0xffffffff;
      if (pbVar3 < pbVar2) {
        this->cursor_ = (char *)(pbVar3 + 1);
        uVar6 = (uint)*pbVar3;
      }
      if (uVar6 != 10) break;
      this->token_start_ = this->cursor_ + -1;
      WastParser::Error(parser,0x19da0f);
      this->line_ = this->line_ + 1;
      this->line_start_ = this->cursor_;
      bVar5 = true;
      if (!bVar4) {
        this->token_start_ = pcVar1;
        goto LAB_0016238e;
      }
    }
    if (uVar6 == 0x5c) {
      pbVar3 = (byte *)this->cursor_;
      uVar6 = 0xffffffff;
      if (pbVar3 < pbVar2) {
        this->cursor_ = (char *)(pbVar3 + 1);
        uVar6 = (uint)*pbVar3;
      }
      uVar8 = uVar6 - 0x22;
      if (uVar8 < 0x3b) {
        if ((0x1f80ffc000U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
          if ((0x400000000000021U >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto LAB_00162348;
          goto LAB_00162281;
        }
LAB_00162297:
        pbVar3 = (byte *)this->cursor_;
        if (pbVar3 < pbVar2) {
          lVar10 = (ulong)*pbVar3 + 1;
        }
        else {
          lVar10 = 0;
        }
        if ((""[lVar10] & 4U) != 0) {
          if (pbVar3 < pbVar2) {
            this->cursor_ = (char *)(pbVar3 + 1);
          }
          goto LAB_00162348;
        }
      }
      else {
LAB_00162281:
        uVar6 = uVar6 - 0x61;
        if (uVar6 < 0x14) {
          if ((0x3fU >> (uVar6 & 0x1f) & 1) != 0) goto LAB_00162297;
          if ((0xa2000U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_00162348;
        }
      }
      this->token_start_ = this->cursor_ + -2;
      WastParser::Error(parser,0x19da21,(char *)0x2);
      bVar5 = true;
    }
    else if (uVar6 == 0x22) {
      bVar4 = false;
    }
    else if (uVar6 == 0xffffffff) {
      BareToken(__return_storage_ptr__,this,Eof);
      return __return_storage_ptr__;
    }
LAB_00162348:
  } while (bVar4);
  this->token_start_ = pcVar1;
  if (bVar5) {
LAB_0016238e:
    iVar7 = ((int)pcVar1 - *(int *)&this->line_start_) + 1;
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    iVar9 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
    if (iVar9 < 2) {
      iVar9 = 1;
    }
    loc.filename.size_._4_4_ = (int)((this->filename_)._M_string_length >> 0x20);
    loc.filename._0_12_ = *(undefined1 (*) [12])&this->filename_;
    loc.field_1.field_0.line = this->line_;
    loc.field_1.field_0.first_column = iVar7;
    loc.field_1.field_0.last_column = iVar9;
    loc.field_1._12_4_ = uStack_74;
    Token::Token(__return_storage_ptr__,loc,First);
  }
  else {
    TextToken(__return_storage_ptr__,this,Text,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetStringToken(WastParser* parser) {
  const char* saved_token_start = token_start_;
  bool has_error = false;
  bool in_string = true;
  ReadChar();
  while (in_string) {
    switch (ReadChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '\n':
        token_start_ = cursor_ - 1;
        ERROR("newline in string");
        has_error = true;
        Newline();
        continue;

      case '"':
        in_string = false;
        break;

      case '\\': {
        switch (ReadChar()) {
          case 't':
          case 'n':
          case 'r':
          case '"':
          case '\'':
          case '\\':
            // Valid escape.
            break;

          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':  // Hex byte escape.
            if (IsHexDigit(PeekChar())) {
              ReadChar();
            } else {
              token_start_ = cursor_ - 2;
              goto error;
            }
            break;

          default:
            token_start_ = cursor_ - 2;
            goto error;

          error:
            ERROR("bad escape \"%.*s\"",
                  static_cast<int>(cursor_ - token_start_), token_start_);
            has_error = true;
            break;
        }
        break;
      }
    }
  }
  token_start_ = saved_token_start;
  if (has_error) {
    return Token(GetLocation(), TokenType::Invalid);
  }

  return TextToken(TokenType::Text);
}